

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

DropAction __thiscall
QMainWindowLayout::performPlatformWidgetDrag
          (QMainWindowLayout *this,QLayoutItem *widgetItem,QPoint *pressPosition)

{
  int iVar1;
  DropAction DVar2;
  undefined4 extraout_var;
  QMimeData *this_00;
  undefined4 extraout_var_00;
  QWindow *pQVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QArrayDataPointer<char> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayDataPointer<char> local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(QLayoutItem **)(this + 0x808) = widgetItem;
  iVar1 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QDrag::QDrag((QDrag *)&local_88,(QObject *)CONCAT44(extraout_var,iVar1));
  this_00 = (QMimeData *)operator_new(0x10);
  QMimeData::QMimeData(this_00);
  iVar1 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
  pQVar3 = QWidget::windowHandle((QWidget *)CONCAT44(extraout_var_00,iVar1));
  latin1.m_data = "application/x-qt-mainwindowdrag-window";
  latin1.m_size = 0x26;
  QString::QString((QString *)&local_a0,latin1);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_78,2);
  QDataStream::operator<<((QDataStream *)&local_58,(longlong)pQVar3);
  local_b8.size = local_78.size;
  local_b8.ptr = local_78.ptr;
  local_b8.d = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QMimeData::setData((QString *)this_00,(QByteArray *)&local_a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  latin1_00.m_data = "application/x-qt-mainwindowdrag-position";
  latin1_00.m_size = 0x28;
  QString::QString((QString *)&local_a0,latin1_00);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_78,2);
  ::operator<<((QDataStream *)&local_58,pressPosition);
  local_b8.size = local_78.size;
  local_b8.ptr = local_78.ptr;
  local_b8.d = local_78.d;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QMimeData::setData((QString *)this_00,(QByteArray *)&local_a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QDrag::setMimeData((QMimeData *)&local_88);
  DVar2 = QDrag::exec((QMimeData *)&local_88,2);
  *(undefined8 *)(this + 0x808) = 0;
  QDrag::~QDrag((QDrag *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar2;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DropAction QMainWindowLayout::performPlatformWidgetDrag(QLayoutItem *widgetItem,
                                                            const QPoint &pressPosition)
{
    draggingWidget = widgetItem;
    QWidget *widget = widgetItem->widget();
    auto drag = QDrag(widget);
    auto mimeData = new QMimeData();
    auto window = widgetItem->widget()->windowHandle();

    auto serialize = [](const auto &object) {
        QByteArray data;
        QDataStream dataStream(&data, QIODevice::WriteOnly);
        dataStream << object;
        return data;
    };
    mimeData->setData("application/x-qt-mainwindowdrag-window"_L1,
                      serialize(reinterpret_cast<qintptr>(window)));
    mimeData->setData("application/x-qt-mainwindowdrag-position"_L1, serialize(pressPosition));
    drag.setMimeData(mimeData);

    auto result = drag.exec();

    draggingWidget = nullptr;
    return result;
}